

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O0

float __thiscall FileReader::next(FileReader *this)

{
  size_type __n;
  bool bVar1;
  runtime_error *this_00;
  unsigned_long *puVar2;
  char *pcVar3;
  float fVar4;
  BufferReader local_78;
  allocator_type local_52;
  value_type_conflict1 local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> data;
  unsigned_long local_30;
  size_type local_28;
  size_t buffer_size;
  FileReader *local_10;
  FileReader *this_local;
  
  local_10 = this;
  bVar1 = isEmpty(this);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Empty file!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = BufferReader::isEmpty(&this->buffer);
  if (bVar1) {
    local_30 = 0x80000;
    data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this->size - this->offset;
    puVar2 = std::min<unsigned_long>
                       (&local_30,
                        (unsigned_long *)
                        &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    __n = *puVar2;
    local_51 = '\0';
    local_28 = __n;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_50,__n,&local_51,&local_52);
    std::allocator<char>::~allocator(&local_52);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_50);
    std::istream::read((char *)&this->file,(long)pcVar3);
    BufferReader::BufferReader(&local_78,(vector<char,_std::allocator<char>_> *)local_50);
    BufferReader::operator=(&this->buffer,&local_78);
    BufferReader::~BufferReader(&local_78);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_50);
  }
  bVar1 = BufferReader::isEmpty(&this->buffer);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this->offset = this->offset + 4;
    fVar4 = BufferReader::next(&this->buffer);
    return fVar4;
  }
  __assert_fail("!buffer.isEmpty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/src/io_utils/file_reader.cpp"
                ,0x38,"float FileReader::next()");
}

Assistant:

float FileReader::next()
{
	if (isEmpty()) {
		throw std::runtime_error("Empty file!");
	}
	if (buffer.isEmpty()) {
		size_t buffer_size = std::min(BYTES_PER_BUFFER, size - offset);
		std::vector<char> data(buffer_size, 0);
		file.read(data.data(), buffer_size);
		buffer = BufferReader(data);
	}
	assert(!buffer.isEmpty());
	offset += sizeof(float);
	return buffer.next();
}